

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

void tinyobj::SplitString
               (string *s,char delim,char escape,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *elems)

{
  char cVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  int i;
  ulong uVar3;
  string token;
  value_type local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  uVar3 = 0;
  bVar2 = false;
  do {
    if (s->_M_string_length <= uVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT71(in_register_00000031,delim),&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      return;
    }
    cVar1 = (s->_M_dataplus)._M_p[uVar3];
    if (bVar2) {
LAB_00146ad5:
      std::__cxx11::string::push_back((char)&local_40);
LAB_00146ae0:
      bVar2 = false;
    }
    else {
      if (cVar1 != '\\') {
        if (cVar1 != ' ') goto LAB_00146ad5;
        if (local_40._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT71(in_register_00000031,delim),&local_40);
        }
        local_40._M_string_length = 0;
        *local_40._M_dataplus._M_p = '\0';
        goto LAB_00146ae0;
      }
      bVar2 = true;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static void SplitString(const std::string &s, char delim, char escape,
                        std::vector<std::string> &elems) {
  std::string token;

  bool escaping = false;
  for (int i = 0; i < s.size(); ++i) {
    char ch = s[i];
    if (escaping) {
      escaping = false;
    } else if (ch == escape) {
      escaping = true;
      continue;
    } else if (ch == delim) {
      if (!token.empty()) {
        elems.push_back(token);
      }
      token.clear();
      continue;
    }
    token += ch;
  }

  elems.push_back(token);
}